

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-xref.c
# Opt level: O0

void pdf_read_start_xref(hd_context *ctx,pdf_document *doc)

{
  int iVar1;
  int64_t iVar2;
  size_t sVar3;
  bool bVar4;
  int64_t t;
  size_t n;
  size_t i;
  uchar buf [1024];
  pdf_document *doc_local;
  hd_context *ctx_local;
  
  buf._1016_8_ = doc;
  hd_seek(ctx,doc->file,0,2);
  iVar2 = hd_tell(ctx,*(hd_stream **)(buf._1016_8_ + 0x20));
  *(int *)(buf._1016_8_ + 0x2c) = (int)iVar2;
  iVar2 = hd_max64(0,(long)*(int *)(buf._1016_8_ + 0x2c) + -0x400);
  hd_seek(ctx,*(hd_stream **)(buf._1016_8_ + 0x20),iVar2,0);
  sVar3 = hd_read(ctx,*(hd_stream **)(buf._1016_8_ + 0x20),(uchar *)&i,0x400);
  if (sVar3 < 9) {
    hd_throw(ctx,2,"cannot find startxref");
  }
  n = sVar3 - 9;
  while (iVar1 = memcmp(buf + (n - 8),"startxref",9), iVar1 != 0) {
    bVar4 = n == 0;
    n = n - 1;
    if (bVar4) goto LAB_0012504f;
  }
  n = n + 9;
  while( true ) {
    bVar4 = false;
    if (n < sVar3) {
      iVar1 = iswhite((uint)buf[n - 8]);
      bVar4 = iVar1 != 0;
    }
    if (!bVar4) break;
    n = n + 1;
  }
  *(undefined4 *)(buf._1016_8_ + 0x28) = 0;
  while( true ) {
    bVar4 = false;
    if ((n < sVar3) && (bVar4 = false, 0x2f < buf[n - 8])) {
      bVar4 = buf[n - 8] < 0x3a;
    }
    if (!bVar4) break;
    if (0x7ffffffe < *(int *)(buf._1016_8_ + 0x28)) {
      hd_throw(ctx,2,"startxref too large");
    }
    *(uint *)(buf._1016_8_ + 0x28) = *(int *)(buf._1016_8_ + 0x28) * 10 + (buf[n - 8] - 0x30);
    n = n + 1;
  }
  if (*(int *)(buf._1016_8_ + 0x28) != 0) {
    return;
  }
LAB_0012504f:
  hd_throw(ctx,2,"cannot find startxref");
}

Assistant:

static void
pdf_read_start_xref(hd_context *ctx, pdf_document *doc)
{
    unsigned char buf[1024];
    size_t i, n;
    int64_t t;

    hd_seek(ctx, doc->file, 0, SEEK_END);

    doc->file_size = hd_tell(ctx, doc->file);

    t = hd_max64(0, doc->file_size - (int64_t)sizeof buf);

    hd_seek(ctx, doc->file, t, SEEK_SET);

    n = hd_read(ctx, doc->file, buf, sizeof buf);
    if (n < 9)
        hd_throw(ctx, HD_ERROR_GENERIC, "cannot find startxref");

    i = n - 9;
    do
    {
        if (memcmp(buf + i, "startxref", 9) == 0)
        {
            i += 9;
            while (i < n && iswhite(buf[i]))
                i ++;
            doc->startxref = 0;
            while (i < n && buf[i] >= '0' && buf[i] <= '9')
            {
                if (doc->startxref >= INT32_MAX)
                    hd_throw(ctx, HD_ERROR_GENERIC, "startxref too large");
                doc->startxref = doc->startxref * 10 + (buf[i++] - '0');
            }
            if (doc->startxref != 0)
                return;
            break;
        }
    } while (i-- > 0);

    hd_throw(ctx, HD_ERROR_GENERIC, "cannot find startxref");
}